

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayerBuilder.cpp
# Opt level: O1

ILayer * __thiscall DenseVanillaLayerBuilder::Build(DenseVanillaLayerBuilder *this,LayerMeta *meta)

{
  pointer pcVar1;
  ILayer *this_00;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_t local_30;
  INeuronBuilder *pIStack_28;
  undefined8 local_20;
  
  this_00 = (ILayer *)operator_new(0x160);
  local_58._0_4_ = meta->alpha;
  pcVar1 = (meta->name)._M_dataplus._M_p;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (meta->name)._M_string_length);
  local_20._0_4_ = meta->width;
  local_20._4_4_ = meta->zShift;
  local_30 = meta->size;
  pIStack_28 = meta->neuronBuilder;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)this_00,(LayerMeta *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

ILayer *DenseVanillaLayerBuilder::Build( LayerMeta meta ) const
{
    return new DenseVanillaLayer( meta );
}